

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

bool Reflection::get<short>(Struct *target,string *name,short *value,size_t offset)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  undefined4 extraout_var_01;
  byte *pbVar4;
  uint8_t *address_1;
  size_t target_size;
  bool target_is_signed;
  uint8_t *address;
  type_info *target_type;
  size_t offset_local;
  short *value_local;
  string *name_local;
  Struct *target_local;
  type_info *this;
  
  iVar2 = (*target->_vptr_Struct[1])(target,name);
  this = (type_info *)CONCAT44(extraout_var,iVar2);
  if (this == (type_info *)0x0) {
    target_local._7_1_ = false;
  }
  else {
    bVar1 = std::type_info::operator==(this,(type_info *)&short::typeinfo);
    if (bVar1) {
      iVar2 = (*target->_vptr_Struct[5])(target,name);
      *value = *(short *)(CONCAT44(extraout_var_00,iVar2) + offset * 2);
      target_local._7_1_ = true;
    }
    else {
      bVar1 = TypeInfo::is_integral(this);
      if (bVar1) {
        TypeInfo::is_signed(this);
        sVar3 = TypeInfo::size(this);
        if (sVar3 < 2) {
          iVar2 = (*target->_vptr_Struct[5])(target,name);
          pbVar4 = (byte *)(CONCAT44(extraout_var_01,iVar2) + offset * sVar3);
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_char::typeinfo);
          if (bVar1) {
            *value = (ushort)*pbVar4;
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&signed_char::typeinfo);
          if (bVar1) {
            *value = (short)(char)*pbVar4;
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_short::typeinfo);
          if (bVar1) {
            *value = *(short *)pbVar4;
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&short::typeinfo);
          if (bVar1) {
            *value = *(short *)pbVar4;
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_int::typeinfo);
          if (bVar1) {
            *value = (short)*(undefined4 *)pbVar4;
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&int::typeinfo);
          if (bVar1) {
            *value = (short)*(undefined4 *)pbVar4;
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_long::typeinfo);
          if (bVar1) {
            *value = (short)*(undefined8 *)pbVar4;
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&long::typeinfo);
          if (bVar1) {
            *value = (short)*(undefined8 *)pbVar4;
          }
          return true;
        }
      }
      target_local._7_1_ = false;
    }
  }
  return target_local._7_1_;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}